

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_enable_msix(int device_fd,uint32_t interrupt_vector)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  int event_fd;
  int *fd_ptr;
  vfio_irq_set *irq_set;
  char irq_set_buf [152];
  undefined1 local_2d8 [524];
  int local_cc;
  long local_c8;
  int local_bc;
  int *local_b8;
  undefined4 *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  uint local_98;
  int local_94 [35];
  uint local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  local_bc = eventfd(0,0);
  local_b0 = &local_a8;
  local_a8 = 0x98;
  if (local_8 == 0) {
    local_8 = 1;
  }
  else if (0x20 < local_8) {
    local_8 = 0x21;
  }
  local_98 = local_8;
  local_a4 = 0x24;
  local_a0 = 2;
  local_9c = 0;
  local_b8 = local_94;
  local_94[0] = local_bc;
  iVar1 = ioctl(local_4,0x3b6e,local_b0);
  local_c8 = (long)iVar1;
  if (local_c8 != -1) {
    return local_bc;
  }
  piVar2 = __errno_location();
  local_cc = *piVar2;
  __xpg_strerror_r(local_cc,local_2d8,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x76,
          "vfio_enable_msix","enable MSIX interrupt",local_2d8);
  exit(local_cc);
}

Assistant:

int vfio_enable_msix(int device_fd, uint32_t interrupt_vector) {
	info("Enable MSIX Interrupts");
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];
	struct vfio_irq_set* irq_set;
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	if (!interrupt_vector) {
		interrupt_vector = 1;
	} else if (interrupt_vector > MAX_INTERRUPT_VECTORS)
		interrupt_vector = MAX_INTERRUPT_VECTORS + 1;

	irq_set->count = interrupt_vector;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	fd_ptr[0] = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSIX interrupt");

	return event_fd;
}